

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::RecordCrashReason(LogMessage *this,CrashReason *reason)

{
  int iVar1;
  
  reason->filename = (char *)fatal_msg_data_exclusive._30488_8_;
  reason->line_number = fatal_msg_data_exclusive._30364_4_;
  reason->message = fatal_msg_data_exclusive + fatal_msg_data_exclusive._30456_8_ + 4;
  iVar1 = GetStackTrace(reason->stack,0x20,4);
  reason->depth = iVar1;
  return;
}

Assistant:

void LogMessage::RecordCrashReason(
    glog_internal_namespace_::CrashReason* reason) {
  reason->filename = fatal_msg_data_exclusive.fullname_;
  reason->line_number = fatal_msg_data_exclusive.line_;
  reason->message = fatal_msg_data_exclusive.message_text_ +
                    fatal_msg_data_exclusive.num_prefix_chars_;
#ifdef HAVE_STACKTRACE
  // Retrieve the stack trace, omitting the logging frames that got us here.
  reason->depth = GetStackTrace(reason->stack, ARRAYSIZE(reason->stack), 4);
#else
  reason->depth = 0;
#endif
}